

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

uchar mbedtls_ssl_hash_from_md_alg(int md)

{
  uchar local_9;
  int md_local;
  
  switch(md) {
  case 3:
    local_9 = '\x01';
    break;
  case 4:
    local_9 = '\x02';
    break;
  case 5:
    local_9 = '\x03';
    break;
  case 6:
    local_9 = '\x04';
    break;
  case 7:
    local_9 = '\x05';
    break;
  case 8:
    local_9 = '\x06';
    break;
  default:
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

unsigned char mbedtls_ssl_hash_from_md_alg( int md )
{
    switch( md )
    {
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            return( MBEDTLS_SSL_HASH_MD5 );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            return( MBEDTLS_SSL_HASH_SHA1 );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
            return( MBEDTLS_SSL_HASH_SHA224 );
        case MBEDTLS_MD_SHA256:
            return( MBEDTLS_SSL_HASH_SHA256 );
#endif
#if defined(MBEDTLS_SHA512_C)
        case MBEDTLS_MD_SHA384:
            return( MBEDTLS_SSL_HASH_SHA384 );
        case MBEDTLS_MD_SHA512:
            return( MBEDTLS_SSL_HASH_SHA512 );
#endif
        default:
            return( MBEDTLS_SSL_HASH_NONE );
    }
}